

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerGL::
GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>::SetDynamicOffset
          (GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo> *this,
          Uint32 ArrayIndex,Uint32 Offset)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  Uint32 Offset_local;
  Uint32 ArrayIndex_local;
  GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo> *this_local;
  
  msg.field_2._8_4_ = Offset;
  msg.field_2._12_4_ = ArrayIndex;
  FormatString<char[63]>
            ((string *)local_38,
             (char (*) [63])"Dynamic offset may only be set for uniform and storage buffers");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"SetDynamicOffset",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderVariableManagerGL.hpp"
             ,0x73);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void SetDynamicOffset(Uint32 ArrayIndex, Uint32 Offset)
        {
            UNSUPPORTED("Dynamic offset may only be set for uniform and storage buffers");
        }